

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<spirv_cross::Meta::Decoration,_0UL>::reserve
          (SmallVector<spirv_cross::Meta::Decoration,_0UL> *this,size_t count)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  ulong uVar18;
  Decoration *pDVar19;
  char *pcVar20;
  char *pcVar21;
  undefined8 *puVar22;
  char *pcVar23;
  long lVar24;
  long lVar25;
  long *plVar26;
  long *plVar27;
  Decoration *pDVar28;
  ulong uVar29;
  byte bVar30;
  
  bVar30 = 0;
  if (count < 0xb60b60b60b60b7) {
    uVar29 = this->buffer_capacity;
    if (uVar29 < count) {
      uVar29 = uVar29 + (uVar29 == 0);
      do {
        uVar18 = uVar29;
        uVar29 = uVar18 * 2;
      } while (uVar18 < count);
      pDVar19 = (Decoration *)malloc(uVar18 * 0x168);
      if (pDVar19 == (Decoration *)0x0) goto LAB_0022d87e;
      pDVar28 = (this->super_VectorView<spirv_cross::Meta::Decoration>).ptr;
      if ((pDVar19 != pDVar28) &&
         ((this->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size != 0)) {
        lVar25 = 0;
        uVar29 = 0;
        do {
          plVar27 = (long *)((long)&(pDVar19->alias)._M_dataplus._M_p + lVar25);
          pDVar28 = (this->super_VectorView<spirv_cross::Meta::Decoration>).ptr;
          pcVar21 = (pDVar19->alias).field_2._M_local_buf + lVar25;
          *(char **)((long)&(pDVar19->alias)._M_dataplus._M_p + lVar25) = pcVar21;
          puVar1 = (undefined8 *)((long)&(pDVar28->alias)._M_dataplus._M_p + lVar25);
          plVar26 = puVar1 + 2;
          if (plVar26 == (long *)*puVar1) {
            uVar3 = *(undefined4 *)((long)puVar1 + 0x14);
            uVar4 = *(undefined4 *)(puVar1 + 3);
            uVar5 = *(undefined4 *)((long)puVar1 + 0x1c);
            *(int *)pcVar21 = (int)*plVar26;
            *(undefined4 *)((long)&(pDVar19->alias).field_2 + lVar25 + 4) = uVar3;
            *(undefined4 *)((long)&(pDVar19->alias).field_2 + lVar25 + 8) = uVar4;
            *(undefined4 *)((long)&(pDVar19->alias).field_2 + lVar25 + 0xc) = uVar5;
          }
          else {
            *plVar27 = (long)*puVar1;
            plVar27[2] = *plVar26;
          }
          puVar1 = (undefined8 *)((long)&(pDVar28->alias)._M_dataplus._M_p + lVar25);
          puVar22 = puVar1 + 6;
          *(undefined8 *)((long)&(pDVar19->alias)._M_string_length + lVar25) = puVar1[1];
          *puVar1 = plVar26;
          puVar1[1] = 0;
          *(undefined1 *)(puVar1 + 2) = 0;
          pcVar21 = (pDVar19->qualified_alias).field_2._M_local_buf + lVar25;
          *(char **)((long)&(pDVar19->qualified_alias)._M_dataplus._M_p + lVar25) = pcVar21;
          if (puVar22 == (undefined8 *)puVar1[4]) {
            uVar3 = *(undefined4 *)((long)puVar1 + 0x34);
            uVar4 = *(undefined4 *)(puVar1 + 7);
            uVar5 = *(undefined4 *)((long)puVar1 + 0x3c);
            *(undefined4 *)pcVar21 = *(undefined4 *)puVar22;
            *(undefined4 *)((long)&(pDVar19->qualified_alias).field_2 + lVar25 + 4) = uVar3;
            *(undefined4 *)((long)&(pDVar19->qualified_alias).field_2 + lVar25 + 8) = uVar4;
            *(undefined4 *)((long)&(pDVar19->qualified_alias).field_2 + lVar25 + 0xc) = uVar5;
          }
          else {
            *(undefined8 **)((long)&(pDVar19->qualified_alias)._M_dataplus._M_p + lVar25) =
                 (undefined8 *)puVar1[4];
            *(undefined8 *)((long)&(pDVar19->qualified_alias).field_2 + lVar25) = *puVar22;
          }
          pcVar20 = (pDVar28->hlsl_semantic).field_2._M_local_buf + lVar25;
          *(undefined8 *)((long)&(pDVar19->qualified_alias)._M_string_length + lVar25) =
               *(undefined8 *)((long)&(pDVar28->qualified_alias)._M_string_length + lVar25);
          *(undefined8 **)((long)&(pDVar28->qualified_alias)._M_dataplus._M_p + lVar25) = puVar22;
          *(undefined8 *)((long)&(pDVar28->qualified_alias)._M_string_length + lVar25) = 0;
          (pDVar28->qualified_alias).field_2._M_local_buf[lVar25] = '\0';
          pcVar23 = (pDVar19->hlsl_semantic).field_2._M_local_buf + lVar25;
          *(char **)((long)&(pDVar19->hlsl_semantic)._M_dataplus._M_p + lVar25) = pcVar23;
          pcVar21 = *(char **)((long)&(pDVar28->hlsl_semantic)._M_dataplus._M_p + lVar25);
          if (pcVar20 == pcVar21) {
            uVar3 = *(undefined4 *)((long)&(pDVar28->hlsl_semantic).field_2 + lVar25 + 4);
            uVar4 = *(undefined4 *)((long)&(pDVar28->hlsl_semantic).field_2 + lVar25 + 8);
            uVar5 = *(undefined4 *)((long)&(pDVar28->hlsl_semantic).field_2 + lVar25 + 0xc);
            *(undefined4 *)pcVar23 = *(undefined4 *)pcVar20;
            *(undefined4 *)((long)&(pDVar19->hlsl_semantic).field_2 + lVar25 + 4) = uVar3;
            *(undefined4 *)((long)&(pDVar19->hlsl_semantic).field_2 + lVar25 + 8) = uVar4;
            *(undefined4 *)((long)&(pDVar19->hlsl_semantic).field_2 + lVar25 + 0xc) = uVar5;
          }
          else {
            *(char **)((long)&(pDVar19->hlsl_semantic)._M_dataplus._M_p + lVar25) = pcVar21;
            *(undefined8 *)((long)&(pDVar19->hlsl_semantic).field_2 + lVar25) =
                 *(undefined8 *)pcVar20;
          }
          lVar24 = (long)&(pDVar28->decoration_flags).higher._M_h._M_buckets + lVar25;
          *(undefined8 *)((long)&(pDVar19->hlsl_semantic)._M_string_length + lVar25) =
               *(undefined8 *)((long)&(pDVar28->hlsl_semantic)._M_string_length + lVar25);
          *(char **)((long)&(pDVar28->hlsl_semantic)._M_dataplus._M_p + lVar25) = pcVar20;
          *(undefined8 *)((long)&(pDVar28->hlsl_semantic)._M_string_length + lVar25) = 0;
          (pDVar28->hlsl_semantic).field_2._M_local_buf[lVar25] = '\0';
          *(undefined8 *)((long)&(pDVar19->decoration_flags).lower + lVar25) =
               *(undefined8 *)((long)&(pDVar28->decoration_flags).lower + lVar25);
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)((long)&(pDVar19->decoration_flags).higher._M_h._M_buckets + lVar25),
                       lVar24,lVar24);
          uVar3 = *(undefined4 *)((long)(pDVar28->extended).values + lVar25 + -0x80);
          uVar4 = *(undefined4 *)((long)(pDVar28->extended).values + lVar25 + -0x7c);
          uVar5 = *(undefined4 *)((long)(pDVar28->extended).values + lVar25 + -0x78);
          uVar6 = *(undefined4 *)((long)(pDVar28->extended).values + lVar25 + -0x74);
          uVar7 = *(undefined4 *)((long)(pDVar28->extended).values + lVar25 + -0x70);
          uVar8 = *(undefined4 *)((long)(pDVar28->extended).values + lVar25 + -0x6c);
          uVar9 = *(undefined4 *)((long)(pDVar28->extended).values + lVar25 + -0x68);
          uVar10 = *(undefined4 *)((long)(pDVar28->extended).values + lVar25 + -100);
          uVar11 = *(undefined4 *)((long)(pDVar28->extended).values + lVar25 + -0x60);
          uVar12 = *(undefined4 *)((long)(pDVar28->extended).values + lVar25 + -0x5c);
          uVar13 = *(undefined4 *)((long)(pDVar28->extended).values + lVar25 + -0x58);
          uVar14 = *(undefined4 *)((long)(pDVar28->extended).values + lVar25 + -0x54);
          uVar15 = *(undefined4 *)((long)(pDVar28->extended).values + lVar25 + -0x4f);
          uVar16 = *(undefined4 *)((long)(pDVar28->extended).values + lVar25 + -0x4b);
          uVar17 = *(undefined4 *)((long)(pDVar28->extended).values + lVar25 + -0x47);
          puVar2 = (undefined4 *)((long)(pDVar19->extended).values + lVar25 + -0x53);
          *puVar2 = *(undefined4 *)((long)(pDVar28->extended).values + lVar25 + -0x53);
          puVar2[1] = uVar15;
          puVar2[2] = uVar16;
          puVar2[3] = uVar17;
          puVar2 = (undefined4 *)((long)(pDVar19->extended).values + lVar25 + -0x60);
          *puVar2 = uVar11;
          puVar2[1] = uVar12;
          puVar2[2] = uVar13;
          puVar2[3] = uVar14;
          puVar2 = (undefined4 *)((long)(pDVar19->extended).values + lVar25 + -0x70);
          *puVar2 = uVar7;
          puVar2[1] = uVar8;
          puVar2[2] = uVar9;
          puVar2[3] = uVar10;
          puVar2 = (undefined4 *)((long)(pDVar19->extended).values + lVar25 + -0x80);
          *puVar2 = uVar3;
          puVar2[1] = uVar4;
          puVar2[2] = uVar5;
          puVar2[3] = uVar6;
          *(undefined8 *)((long)(pDVar19->extended).values + lVar25 + -0x40) =
               *(undefined8 *)((long)(pDVar28->extended).values + lVar25 + -0x40);
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)(plVar27 + 0x1d),(long)(pDVar28->extended).values + lVar25 + -0x38);
          plVar26 = (long *)((long)(pDVar28->extended).values + lVar25);
          plVar27 = plVar27 + 0x24;
          for (lVar24 = 8; lVar24 != 0; lVar24 = lVar24 + -1) {
            *plVar27 = *plVar26;
            plVar26 = plVar26 + (ulong)bVar30 * -2 + 1;
            plVar27 = plVar27 + (ulong)bVar30 * -2 + 1;
          }
          *(undefined4 *)((long)(pDVar19->extended).values + lVar25 + 0x40) =
               *(undefined4 *)((long)(pDVar28->extended).values + lVar25 + 0x40);
          pDVar28 = (this->super_VectorView<spirv_cross::Meta::Decoration>).ptr;
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)((long)(pDVar28->extended).values + lVar25 + -0x38));
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)((long)&(pDVar28->decoration_flags).higher._M_h._M_buckets + lVar25));
          pcVar21 = *(char **)((long)&(pDVar28->hlsl_semantic)._M_dataplus._M_p + lVar25);
          if ((pDVar28->hlsl_semantic).field_2._M_local_buf + lVar25 != pcVar21) {
            operator_delete(pcVar21);
          }
          pcVar21 = *(char **)((long)&(pDVar28->qualified_alias)._M_dataplus._M_p + lVar25);
          if ((pDVar28->qualified_alias).field_2._M_local_buf + lVar25 != pcVar21) {
            operator_delete(pcVar21);
          }
          puVar1 = (undefined8 *)((long)&(pDVar28->alias)._M_dataplus._M_p + lVar25);
          puVar22 = (undefined8 *)*puVar1;
          if (puVar1 + 2 != puVar22) {
            operator_delete(puVar22);
          }
          uVar29 = uVar29 + 1;
          lVar25 = lVar25 + 0x168;
        } while (uVar29 < (this->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size);
        pDVar28 = (this->super_VectorView<spirv_cross::Meta::Decoration>).ptr;
      }
      if (pDVar28 != (Decoration *)0x0) {
        free(pDVar28);
      }
      (this->super_VectorView<spirv_cross::Meta::Decoration>).ptr = pDVar19;
      this->buffer_capacity = uVar18;
    }
    return;
  }
LAB_0022d87e:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}